

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcFastenerType::~IfcFastenerType(IfcFastenerType *this)

{
  ~IfcFastenerType(this);
  operator_delete(this,0x1b8);
  return;
}

Assistant:

IfcFastenerType() : Object("IfcFastenerType") {}